

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherCWrapper.cpp
# Opt level: O0

char * efsw_getlasterror(void)

{
  int iVar1;
  char *pcVar2;
  string local_28 [32];
  
  if (efsw_getlasterror::log_str_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&efsw_getlasterror::log_str_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&efsw_getlasterror::log_str_abi_cxx11_);
      __cxa_atexit(std::__cxx11::string::~string,&efsw_getlasterror::log_str_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&efsw_getlasterror::log_str_abi_cxx11_);
    }
  }
  efsw::Errors::Log::getLastErrorLog_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&efsw_getlasterror::log_str_abi_cxx11_,local_28);
  std::__cxx11::string::~string(local_28);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  return pcVar2;
}

Assistant:

const char* efsw_getlasterror()
{
	static std::string log_str;
	log_str = efsw::Errors::Log::getLastErrorLog();
	return log_str.c_str();
}